

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O3

void duckdb_je_buf_writer_pipe(buf_writer_t *buf_writer,read_cb_t *read_cb,void *read_cbopaque)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (buf_writer->buf == (char *)0x0) {
    duckdb_je_buf_writer_pipe::backup_buf_writer.cbopaque = buf_writer->cbopaque;
    duckdb_je_buf_writer_pipe::backup_buf_writer.write_cb = duckdb_je_malloc_message;
    if (duckdb_je_malloc_message == (write_cb_t *)0x0) {
      duckdb_je_buf_writer_pipe::backup_buf_writer.write_cb = duckdb_je_wrtmessage;
    }
    if (buf_writer->write_cb != (write_cb_t *)0x0) {
      duckdb_je_buf_writer_pipe::backup_buf_writer.write_cb = buf_writer->write_cb;
    }
    buf_writer = &duckdb_je_buf_writer_pipe::backup_buf_writer;
    duckdb_je_buf_writer_pipe::backup_buf_writer.buf = duckdb_je_buf_writer_pipe::backup_buf;
    duckdb_je_buf_writer_pipe::backup_buf_writer.internal_buf = false;
    duckdb_je_buf_writer_pipe::backup_buf_writer.buf_size = 0xf;
    duckdb_je_buf_writer_pipe::backup_buf_writer.buf_end = 0;
  }
  lVar2 = 0;
  do {
    sVar1 = lVar2 + buf_writer->buf_end;
    buf_writer->buf_end = sVar1;
    pcVar4 = buf_writer->buf;
    sVar3 = buf_writer->buf_size;
    if (sVar1 == buf_writer->buf_size) {
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
        sVar3 = sVar1;
      }
      else {
        pcVar4[sVar1] = '\0';
        (*buf_writer->write_cb)(buf_writer->cbopaque,buf_writer->buf);
        buf_writer->buf_end = 0;
        pcVar4 = buf_writer->buf;
        sVar1 = 0;
        sVar3 = buf_writer->buf_size;
      }
    }
    lVar2 = (*read_cb)(read_cbopaque,pcVar4 + sVar1,sVar3 - sVar1);
  } while (0 < lVar2);
  if (buf_writer->buf != (char *)0x0) {
    buf_writer->buf[buf_writer->buf_end] = '\0';
    (*buf_writer->write_cb)(buf_writer->cbopaque,buf_writer->buf);
    buf_writer->buf_end = 0;
  }
  return;
}

Assistant:

void
buf_writer_pipe(buf_writer_t *buf_writer, read_cb_t *read_cb,
    void *read_cbopaque) {
	/*
	 * A tiny local buffer in case the buffered writer failed to allocate
	 * at init.
	 */
	static char backup_buf[16];
	static buf_writer_t backup_buf_writer;

	buf_writer_assert(buf_writer);
	assert(read_cb != NULL);
	if (buf_writer->buf == NULL) {
		buf_writer_init(TSDN_NULL, &backup_buf_writer,
		    buf_writer->write_cb, buf_writer->cbopaque, backup_buf,
		    sizeof(backup_buf));
		buf_writer = &backup_buf_writer;
	}
	assert(buf_writer->buf != NULL);
	ssize_t nread = 0;
	do {
		buf_writer->buf_end += nread;
		buf_writer_assert(buf_writer);
		if (buf_writer->buf_end == buf_writer->buf_size) {
			buf_writer_flush(buf_writer);
		}
		nread = read_cb(read_cbopaque,
		    buf_writer->buf + buf_writer->buf_end,
		    buf_writer->buf_size - buf_writer->buf_end);
	} while (nread > 0);
	buf_writer_flush(buf_writer);
}